

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::TypeParameterDeclarationSyntax::setChild
          (TypeParameterDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004d1bd0 + *(int *)(&DAT_004d1bd0 + index * 4)))();
  return;
}

Assistant:

void TypeParameterDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: typeKeyword = child.token(); return;
        case 2: typeRestriction = child.node() ? &child.node()->as<ForwardTypeRestrictionSyntax>() : nullptr; return;
        case 3: declarators = child.node()->as<SeparatedSyntaxList<TypeAssignmentSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}